

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O3

void set_reader_options(bsdtar *bsdtar,archive *a)

{
  wchar_t wVar1;
  char *pcVar2;
  size_t sVar3;
  char *options;
  int *piVar4;
  
  pcVar2 = getenv("TAR_READER_OPTIONS");
  if (pcVar2 == (char *)0x0) {
    return;
  }
  sVar3 = strlen(pcVar2);
  options = (char *)malloc(sVar3 + 0x1f);
  if (options != (char *)0x0) {
    builtin_strncpy(options,"__ignore_wrong_module_name__,",0x1d);
    strcpy(options + 0x1d,pcVar2);
    wVar1 = archive_read_set_options((archive *)bsdtar,options);
    free(options);
    if (L'\xffffffeb' < wVar1) {
      archive_clear_error((archive *)bsdtar);
      return;
    }
    pcVar2 = archive_error_string((archive *)bsdtar);
    lafe_errc(1,0,"%s",pcVar2);
  }
  piVar4 = __errno_location();
  lafe_errc(1,*piVar4,"Out of memory");
}

Assistant:

static void
set_reader_options(struct bsdtar *bsdtar, struct archive *a)
{
	const char *reader_options;
	int r;

	(void)bsdtar; /* UNUSED */

	reader_options = getenv(ENV_READER_OPTIONS);
	if (reader_options != NULL) {
		char *p;
		/* Set default write options. */
		p = malloc(sizeof(IGNORE_WRONG_MODULE_NAME)
		    + strlen(reader_options) + 1);
		if (p == NULL)
			lafe_errc(1, errno, "Out of memory");
		/* Prepend magic code to ignore options for
		 * a format or filters which are not added to
		 * the archive write object. */
		strncpy(p, IGNORE_WRONG_MODULE_NAME,
		    sizeof(IGNORE_WRONG_MODULE_NAME) -1);
		strcpy(p + sizeof(IGNORE_WRONG_MODULE_NAME) -1, reader_options);
		r = archive_read_set_options(a, p);
		free(p);
		if (r < ARCHIVE_WARN)
			lafe_errc(1, 0, "%s", archive_error_string(a));
		else
			archive_clear_error(a);
	}
}